

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testharness.h
# Opt level: O3

Tester * __thiscall leveldb::test::Tester::Is(Tester *this,bool b,char *msg)

{
  undefined1 *puVar1;
  size_t sVar2;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,b) == 0) {
    puVar1 = &this->field_0x28;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," Assertion failure ",0x13)
    ;
    if (msg == (char *)0x0) {
      std::ios::clear((int)puVar1 + (int)*(undefined8 *)(*(long *)puVar1 + -0x18));
    }
    else {
      sVar2 = strlen(msg);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,msg,sVar2);
    }
    this->ok_ = false;
  }
  return this;
}

Assistant:

Tester& Is(bool b, const char* msg) {
    if (!b) {
      ss_ << " Assertion failure " << msg;
      ok_ = false;
    }
    return *this;
  }